

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsMouseHoveringRect(ImVec2 *r_min,ImVec2 *r_max,bool clip)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImGuiViewportP *pIVar5;
  undefined3 in_register_00000011;
  uint uVar6;
  float fVar7;
  ImVec2 IVar8;
  float fVar9;
  float fVar10;
  
  fVar9 = (*r_min).x;
  fVar10 = (*r_min).y;
  IVar8 = *r_max;
  if (CONCAT31(in_register_00000011,clip) != 0) {
    pIVar4 = GImGui->CurrentWindow;
    fVar1 = (pIVar4->ClipRect).Min.x;
    fVar2 = (pIVar4->ClipRect).Min.y;
    uVar6 = -(uint)(fVar1 <= fVar9);
    fVar9 = (float)(~uVar6 & (uint)fVar1 | uVar6 & (uint)fVar9);
    uVar6 = -(uint)(fVar2 <= fVar10);
    fVar10 = (float)(~uVar6 & (uint)fVar2 | (uint)fVar10 & uVar6);
    fVar1 = (pIVar4->ClipRect).Max.x;
    fVar2 = (pIVar4->ClipRect).Max.y;
    fVar7 = IVar8.y;
    if (fVar2 <= IVar8.y) {
      fVar7 = fVar2;
    }
    if (fVar1 <= IVar8.x) {
      IVar8.y = 0.0;
      IVar8.x = fVar1;
    }
    IVar8.y = fVar7;
  }
  fVar1 = (GImGui->Style).TouchExtraPadding.x;
  fVar2 = (GImGui->IO).MousePos.x;
  if (fVar9 - fVar1 <= fVar2) {
    fVar7 = (GImGui->Style).TouchExtraPadding.y;
    fVar3 = (GImGui->IO).MousePos.y;
    if (((fVar10 - fVar7 <= fVar3) && (fVar2 < fVar1 + IVar8.x)) && (fVar3 < fVar7 + IVar8.y)) {
      pIVar5 = GImGui->MouseViewport;
      fVar1 = (pIVar5->super_ImGuiViewport).Pos.x;
      fVar2 = (pIVar5->super_ImGuiViewport).Pos.y;
      return (bool)((fVar1 < IVar8.x && fVar9 < (pIVar5->super_ImGuiViewport).Size.x + fVar1) &
                   -(fVar10 < (pIVar5->super_ImGuiViewport).Size.y + fVar2) & -(fVar2 < IVar8.y));
    }
  }
  return false;
}

Assistant:

bool ImGui::IsMouseHoveringRect(const ImVec2& r_min, const ImVec2& r_max, bool clip)
{
    ImGuiContext& g = *GImGui;

    // Clip
    ImRect rect_clipped(r_min, r_max);
    if (clip)
        rect_clipped.ClipWith(g.CurrentWindow->ClipRect);

    // Expand for touch input
    const ImRect rect_for_touch(rect_clipped.Min - g.Style.TouchExtraPadding, rect_clipped.Max + g.Style.TouchExtraPadding);
    if (!rect_for_touch.Contains(g.IO.MousePos))
        return false;
    if (!g.MouseViewport->GetMainRect().Overlaps(rect_clipped))
        return false;
    return true;
}